

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::hasImports(Model *this)

{
  EntityImpl *pEVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  UnitsPtr units;
  undefined1 local_58 [16];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  bVar2 = false;
  uVar4 = 0;
  while ((pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity
                   .mPimpl,
         uVar4 < (ulong)((long)(pEVar1[4].mId.field_2._M_allocated_capacity -
                               pEVar1[4].mId._M_string_length) >> 4) && (bVar2 == false))) {
    Model::units((Model *)local_58,(size_t)this);
    bVar2 = hasUnitsImports((UnitsPtr *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    uVar4 = uVar4 + 1;
  }
  bVar3 = true;
  if (bVar2 == false) {
    std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Model,void>
              ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libcellml::Model>);
    local_58._0_8_ = local_48;
    local_58._8_8_ = a_Stack_40[0]._M_pi;
    local_48 = (element_type *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bVar3 = hasComponentImports((ComponentEntityConstPtr *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  return bVar3;
}

Assistant:

bool Model::hasImports() const
{
    bool importsPresent = false;
    for (size_t index = 0; (index < unitsCount()) && !importsPresent; ++index) {
        libcellml::UnitsPtr units = Model::units(index);
        importsPresent = hasUnitsImports(units);
    }

    if (!importsPresent) {
        importsPresent = hasComponentImports(shared_from_this());
    }

    return importsPresent;
}